

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

bool pugi::impl::(anonymous_namespace)::set_value_integer<unsigned_long_long,char*,unsigned_long>
               (char **dest,unsigned_long *header,uintptr_t header_mask,unsigned_long_long value,
               bool negative)

{
  bool bVar1;
  ulong uVar2;
  uintptr_t uVar3;
  long lVar4;
  long lVar5;
  char_t buf [64];
  char_t acStack_c [12];
  
  uVar3 = -header_mask;
  if ((int)value == 0) {
    uVar3 = header_mask;
  }
  lVar5 = 0;
  do {
    lVar4 = lVar5;
    acStack_c[lVar4 + 3] = (char)uVar3 + (char)(uVar3 / 10) * -10 | 0x30;
    lVar5 = lVar4 + -1;
    bVar1 = 9 < uVar3;
    uVar3 = uVar3 / 10;
  } while (bVar1);
  acStack_c[lVar4 + 2] = '-';
  uVar2 = (ulong)(byte)((byte)value ^ 1);
  bVar1 = strcpy_insitu<char*,unsigned_long>
                    (dest,header,0x10,acStack_c + uVar2 + lVar5 + 3,1 - (uVar2 + lVar5));
  return bVar1;
}

Assistant:

PUGI_IMPL_FN bool set_value_integer(String& dest, Header& header, uintptr_t header_mask, U value, bool negative)
	{
		char_t buf[64];
		char_t* end = buf + sizeof(buf) / sizeof(buf[0]);
		char_t* begin = integer_to_string(buf, end, value, negative);

		return strcpy_insitu(dest, header, header_mask, begin, end - begin);
	}